

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  ulong uVar7;
  int *piVar8;
  Allocator *pAVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  long *plVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  int k_8;
  Layer *pLVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  Mat *pMVar20;
  bool bVar21;
  int i_6;
  int iVar22;
  char cVar23;
  int j;
  uint uVar24;
  undefined8 *puVar25;
  int j_8;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined4 *puVar30;
  undefined4 *puVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  void *pvVar37;
  int k;
  int iVar38;
  _func_int **pp_Var39;
  int k_6;
  uint num_input;
  ulong uVar40;
  _func_int **pp_Var41;
  int q;
  int iVar42;
  _func_int **pp_Var43;
  char cVar44;
  int k_4;
  ulong uVar45;
  _func_int *p_Var46;
  Mat *pMVar47;
  int i;
  _func_int **pp_Var48;
  undefined4 *puVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  byte bVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar76;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  Mat *local_180;
  ParamDict pd_5;
  undefined8 uStack_130;
  ParamDict pd;
  undefined1 local_118 [8];
  int local_110;
  Allocator *local_108;
  int iStack_100;
  int iStack_fc;
  size_t sStack_f8;
  int local_f0 [2];
  size_t local_e8 [2];
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  size_t local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  size_t sStack_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  Mat *local_90;
  ulong local_88;
  Mat *local_80;
  ModelBinFromMatArray local_78;
  long local_68;
  void *local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  void *local_40;
  long local_38;
  
  pp_Var39 = this->_vptr_Convolution_x86_avx;
  p_Var46 = pp_Var39[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var46) != 0) {
    return 0;
  }
  switch(*(undefined4 *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var46 + 4))) {
  case 1:
    pLVar16 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 2:
    pLVar16 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var46));
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 3:
    pLVar16 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var46));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var46) + 4));
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 4:
    pLVar16 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 5:
    pLVar16 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 6:
    pLVar16 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var46));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var46) + 4));
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  default:
    pLVar16 = (Layer *)0x0;
    goto LAB_002237eb;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar16->_vptr_Layer[4])(pLVar16,opt);
  pp_Var39 = this->_vptr_Convolution_x86_avx;
LAB_002237eb:
  this->activation = pLVar16;
  p_Var46 = pp_Var39[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var46) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
  iVar22 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
  uVar28 = (long)*(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var46) /
           (long)(iVar22 * iVar42);
  uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
  uVar29 = (ulong)(int)uVar33;
  uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) /
           (long)(int)uVar33;
  uVar17 = uVar28 & 0xffffffff;
  bVar21 = opt->use_packing_layout;
  if ((((iVar42 == iVar22 && bVar21 == false) &&
       (iVar38 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46), iVar38 != 1))
      && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == iVar38)) &&
     ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
      (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) {
    pLVar16 = create_layer(6);
    this->convolution_dilation1 = pLVar16;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).h +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).d +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).c +
                           (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elempack +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,6,*(int *)(&(this->weight_winograd43_data).field_0x1c +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var39 = this->_vptr_Convolution_x86_avx;
    if (*(int *)((long)&(this->weight_winograd43_data).elempack + (long)pp_Var39[-3]) == 0) {
      local_e8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_118 = SUB128(ZEXT812(0),4);
      local_110 = 0;
      local_108 = (Allocator *)0x0;
      iStack_100 = 0;
      local_f0[0] = 0;
      p_Var46 = pp_Var39[-3];
      iStack_fc = pd.d._4_4_;
      sStack_f8 = (size_t)local_118;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var46)) {
        piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        pd.d._0_4_ = (undefined4)uVar6;
        pd.d._4_4_ = (int)((ulong)uVar6 >> 0x20);
        local_118 = *(undefined1 (*) [8])
                     ((long)&(this->weight_winograd63_data).cstep + (long)p_Var46);
        local_110 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var46);
        local_108 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46);
        sStack_f8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var46);
        iStack_100 = (int)uVar6;
        iStack_fc = (int)((ulong)uVar6 >> 0x20);
        local_f0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var46);
        local_e8[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var46);
      }
      pLVar16 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_78,(Mat *)&pd);
      (*pLVar16->_vptr_Layer[3])(pLVar16,&local_78);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_78);
      piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_108 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_108->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_e8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_118 = SUB128(ZEXT812(0),4);
      local_110 = 0;
      local_108 = (Allocator *)0x0;
      iStack_100 = 0;
      local_f0[0] = 0;
      p_Var46 = pp_Var39[-3];
      iStack_fc = pd.d._4_4_;
      sStack_f8 = (size_t)local_118;
      sStack_b0 = (size_t)local_118;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var46)) {
        piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        pd.d._0_4_ = (undefined4)uVar6;
        pd.d._4_4_ = (int)((ulong)uVar6 >> 0x20);
        local_118 = *(undefined1 (*) [8])
                     ((long)&(this->weight_winograd63_data).cstep + (long)p_Var46);
        local_110 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var46);
        local_108 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46);
        sStack_f8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var46);
        iStack_100 = (int)uVar6;
        iStack_fc = (int)((ulong)uVar6 >> 0x20);
        local_f0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var46);
        local_e8[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var46);
        p_Var46 = this->_vptr_Convolution_x86_avx[-3];
      }
      local_a0 = 0;
      local_a8 = 0;
      uStack_b4 = 0;
      uStack_b8 = 0;
      local_c0 = 0;
      local_c8 = 0;
      uStack_d4 = 0;
      uStack_d8 = 0;
      local_e8[1] = 0;
      local_d0 = sStack_b0;
      if ((_func_int *)(local_e8 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).dims + (long)p_Var46)) {
        piVar8 = *(int **)((long)&(this->scale_in_data).h + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        local_e8[1] = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).h + (long)p_Var46);
        uStack_d8 = (undefined4)uVar6;
        uStack_d4 = (undefined4)((ulong)uVar6 >> 0x20);
        local_d0 = *(size_t *)((long)&(this->scale_in_data).c + (long)p_Var46);
        local_c8 = *(undefined4 *)((long)&(this->scale_in_data).cstep + (long)p_Var46);
        local_c0 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var46);
        sStack_b0 = *(size_t *)(&this->field_0x1d8 + (long)p_Var46);
        uStack_b8 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var46);
        uStack_b4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var46) >> 0x20)
        ;
        local_a8 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var46);
        local_a0 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var46);
      }
      pLVar16 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_78,(Mat *)&pd);
      (*pLVar16->_vptr_Layer[3])(pLVar16,&local_78);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_78);
      lVar26 = 0x48;
      do {
        piVar8 = *(int **)((long)&pd.d + lVar26);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (*(long **)((long)&local_108 + lVar26) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar26));
            }
            else {
              (**(code **)(**(long **)((long)&local_108 + lVar26) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_e8 + lVar26) = 0;
        *(undefined8 *)((long)&pd.d + lVar26 + 4) = 0;
        *(undefined8 *)(local_118 + lVar26 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar26) = 0;
        *(undefined8 *)((long)&pd.d + lVar26) = 0;
        *(undefined4 *)((long)local_f0 + lVar26) = 0;
        *(undefined8 *)((long)&iStack_100 + lVar26) = 0;
        *(undefined8 *)((long)local_f0 + lVar26 + -8) = 0;
        lVar26 = lVar26 + -0x48;
      } while (lVar26 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var46 = this->_vptr_Convolution_x86_avx[-3];
      piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          plVar13 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var46);
          if (plVar13 == (long *)0x0) {
            free(*(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var46));
          }
          else {
            (**(code **)(*plVar13 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var46) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var46 + 4)) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var46) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var46) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  num_input = (uint)uVar28;
  lVar26 = (long)(int)num_input;
  uVar24 = (int)num_input >> 0x1f;
  if (bVar21 == false) {
    cVar44 = '\x01';
    bVar50 = false;
LAB_00223f8b:
    bVar53 = bVar21 ^ 1;
    bVar51 = false;
    bVar21 = false;
LAB_00223f94:
    bVar52 = cVar44 == '\x01';
    if ((!bVar50) || (cVar44 != '\x01')) goto LAB_00224550;
    p_Var46 = this->_vptr_Convolution_x86_avx[-3];
    iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
    if (iVar42 == 3) {
      if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
           (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1)) ||
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1 ||
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1))))
      goto LAB_002242fd;
      if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)) {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        pd_5._vptr_ParamDict = (_func_int **)0x0;
        pd_5.d._0_4_ = 0;
        pd_5.d._4_4_ = 0;
        Mat::create((Mat *)&pd_5,0x40,num_input,uVar33,4,(Allocator *)0x0);
        local_80 = &this->weight_winograd63_data;
        uVar28 = 0;
        if (0 < (int)num_input) {
          uVar28 = uVar17;
        }
        local_180 = (Mat *)CONCAT44(local_180._4_4_,uVar33);
        uVar29 = 0;
        if (0 < (int)uVar33) {
          uVar29 = (ulong)uVar33;
        }
        for (uVar40 = 0; uVar40 != uVar29; uVar40 = uVar40 + 1) {
          lVar34 = (long)(int)(num_input * 9 * (int)uVar40) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          for (uVar45 = 0; uVar45 != uVar28; uVar45 = uVar45 + 1) {
            lVar36 = uVar45 * 0x24;
            fVar2 = *(float *)(lVar34 + 0x18 + lVar36);
            fVar3 = *(float *)(lVar34 + 0x1c + lVar36);
            fVar4 = *(float *)(lVar34 + 0x20 + lVar36);
            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar36)),
                                    ZEXT416(*(uint *)(lVar34 + 0x10 + lVar36)),0x10);
            auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar36)),
                                    ZEXT416(*(uint *)(lVar34 + 4 + lVar36)),0x10);
            auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar36)),
                                    ZEXT416(*(uint *)(lVar34 + 0x14 + lVar36)),0x10);
            for (lVar36 = 8; lVar36 != 0x68; lVar36 = lVar36 + 0xc) {
              uVar35 = *(ulong *)("N4ncnn19Convolution_x86_avxE" + lVar36 + 0x18);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = uVar35;
              fVar65 = (float)uVar35;
              auVar77._0_4_ = fVar65 * auVar61._0_4_;
              fVar76 = (float)(uVar35 >> 0x20);
              auVar77._4_4_ = fVar76 * auVar61._4_4_;
              auVar77._8_4_ = auVar61._8_4_ * 0.0;
              auVar77._12_4_ = auVar61._12_4_ * 0.0;
              auVar89 = vshufps_avx(auVar77,auVar77,0xe1);
              fVar5 = *(float *)((long)&DAT_004c8710 + lVar36);
              auVar78._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
              auVar78._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
              auVar78._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
              auVar78._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
              uVar6 = vmovlps_avx(auVar78);
              *(undefined8 *)((long)&uStack_130 + lVar36) = uVar6;
              auVar89 = vmovshdup_avx(auVar66);
              *(float *)((long)&pd._vptr_ParamDict + lVar36) =
                   auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
            }
            pp_Var39 = pd_5._vptr_ParamDict;
            for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
              fVar2 = *(float *)((long)&pd._vptr_ParamDict + lVar36 * 0xc);
              uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar36 * 0xc + 4);
              puVar25 = (undefined8 *)((long)&DAT_004c8710 + 4);
              for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
                auVar55._0_4_ = (float)*puVar25 * (float)uVar6;
                auVar55._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                auVar55._8_8_ = 0;
                auVar14 = vmovshdup_avx(auVar55);
                *(float *)((long)pp_Var39 + lVar18 * 4) =
                     auVar55._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
                puVar25 = (undefined8 *)((long)puVar25 + 0xc);
              }
              pp_Var39 = pp_Var39 + 4;
            }
          }
        }
        Mat::create(local_80,num_input,0x40,((int)uVar33 / 8) * -7 + uVar33,0x20,8,(Allocator *)0x0)
        ;
        iVar42 = (this->weight_winograd63_data).w;
        pvVar10 = (this->weight_winograd63_data).data;
        sVar11 = (this->weight_winograd63_data).elemsize;
        sVar12 = (this->weight_winograd63_data).cstep;
        for (uVar28 = 0; (long)(uVar28 | 7) < (long)(int)uVar33; uVar28 = uVar28 + 8) {
          lVar34 = 0;
          for (lVar36 = 0; lVar36 != 0x40; lVar36 = lVar36 + 1) {
            lVar18 = (long)pvVar10 +
                     (long)iVar42 * sVar11 * lVar36 + (uVar28 >> 3) * sVar12 * sVar11;
            for (uVar29 = 0; (long)(uVar29 | 7) < lVar26; uVar29 = uVar29 + 8) {
              for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
                for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                  *(undefined4 *)(lVar18 + lVar32) =
                       *(undefined4 *)(lVar34 + (long)pd_5._vptr_ParamDict);
                }
                lVar18 = lVar18 + 0x20;
              }
            }
            lVar34 = lVar34 + 4;
          }
        }
        iVar42 = (this->weight_winograd63_data).w;
        pvVar10 = (this->weight_winograd63_data).data;
        sVar11 = (this->weight_winograd63_data).elemsize;
        sVar12 = (this->weight_winograd63_data).cstep;
        for (; (long)uVar28 < (long)(int)uVar33; uVar28 = uVar28 + 1) {
          pp_Var39 = pd_5._vptr_ParamDict;
          for (lVar34 = 0; lVar34 != 0x40; lVar34 = lVar34 + 1) {
            lVar36 = (long)pvVar10 +
                     (long)iVar42 * sVar11 * lVar34 +
                     (ulong)(((uint)uVar28 & 7) + ((uint)(uVar28 >> 3) & 0x1fffffff)) *
                     sVar12 * sVar11;
            for (uVar29 = 0; (long)(uVar29 | 7) < lVar26; uVar29 = uVar29 + 8) {
              for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 4) {
                *(undefined4 *)(lVar36 + lVar18) = *(undefined4 *)pp_Var39;
              }
              lVar36 = lVar36 + 0x20;
            }
            pp_Var39 = (_func_int **)((long)pp_Var39 + 4);
          }
        }
        piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            free(pd_5._vptr_ParamDict);
          }
        }
        bVar52 = true;
        goto LAB_00224550;
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_data_tm,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),3,3,8,1);
      bVar52 = true;
    }
    else if (((iVar42 == 1) &&
             (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1))
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
             ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),1,1);
      bVar52 = true;
    }
    else {
LAB_002242fd:
      pMVar47 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
      iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
      if (opt->use_sgemm_convolution == true) {
        convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                  (pMVar47,&this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
      }
      else {
        convolution_transform_kernel_packed_sse
                  (pMVar47,&this->weight_data_tm,num_input,iVar22,iVar42,iVar38,8,1);
      }
      bVar52 = true;
    }
  }
  else {
    bVar50 = (uVar28 & 7) == 0;
    cVar44 = ((uVar29 & 3) == 0) * '\x03' + '\x01';
    if ((uVar33 & 7) == 0) {
      cVar44 = '\b';
    }
    if (((num_input | uVar33) & 7) != 0) goto LAB_00223ac0;
    if (((iVar22 == 1 && iVar42 == 1) &&
        (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
       (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
        ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
      convolution_im2col_sgemm_transform_kernel_pack8_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,num_input,uVar33,1,1);
LAB_00223c29:
      cVar44 = '\b';
      goto LAB_00223f8b;
    }
    if ((opt->use_winograd_convolution != true) ||
       (((bVar51 = opt->use_winograd23_convolution, bVar51 == false &&
         (opt->use_winograd43_convolution == false)) && (opt->use_winograd63_convolution != true))))
    {
      if (iVar42 == 2) goto LAB_00223ecb;
      if (((iVar42 == 3) && (iVar22 == 3)) &&
         (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1))
      goto LAB_00223e3b;
LAB_00223f38:
      pMVar47 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
      if (opt->use_sgemm_convolution == true) {
        convolution_im2col_sgemm_transform_kernel_pack8_avx
                  (pMVar47,&this->weight_sgemm_data,num_input,uVar33,iVar42,iVar22);
      }
      else {
        convolution_transform_kernel_packed_sse
                  (pMVar47,&this->weight_data_tm,num_input,uVar33,iVar42,iVar22,8,8);
      }
      cVar44 = '\b';
      goto LAB_00223f8b;
    }
    if (iVar42 == 2) {
LAB_00223ecb:
      if (((iVar22 == 2) &&
          (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
          ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))))) {
        cVar44 = '\b';
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,num_input,uVar33,2,2,8,8);
        goto LAB_00223f8b;
      }
      goto LAB_00223f38;
    }
    if (((iVar42 != 3) || (iVar22 != 3)) ||
       (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1))
    goto LAB_00223f38;
    if (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1) ||
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1)) ||
       (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)) {
LAB_00223e3b:
      if (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1) &&
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
         (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) {
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,num_input,uVar33,3,3,8,8);
        goto LAB_00223c29;
      }
      goto LAB_00223f38;
    }
    if ((int)num_input < 9) {
      if ((int)uVar33 < 9) goto LAB_00223e3b;
      cVar23 = opt->use_winograd63_convolution;
      bVar21 = false;
LAB_00226d5a:
      if (opt->use_winograd43_convolution == false) {
        if (bVar51 != false) goto LAB_00226f58;
        goto LAB_002272be;
      }
      if ((!(bool)(0xf < (int)uVar33 & bVar21)) && (cVar23 != '\0' || bVar51 != false)) {
LAB_00226f58:
        local_e8[0] = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_118 = SUB168(ZEXT816(0),4);
        local_110 = 0;
        local_108 = (Allocator *)0x0;
        iStack_100 = 0;
        local_f0[0] = 0;
        iStack_fc = pd.d._4_4_;
        sStack_f8 = (size_t)local_118;
        Mat::create((Mat *)&pd,0x10,num_input,uVar33,4,(Allocator *)0x0);
        uVar40 = 0;
        if (0 < (int)num_input) {
          uVar40 = uVar17;
        }
        uVar45 = 0;
        if (0 < (int)uVar33) {
          uVar45 = (ulong)uVar33;
        }
        for (uVar35 = 0; uVar35 != uVar45; uVar35 = uVar35 + 1) {
          lVar34 = (long)(int)(num_input * 9 * (int)uVar35) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          lVar36 = (long)iStack_fc * (long)local_118;
          pp_Var39 = (_func_int **)
                     ((long)local_118 * local_e8[0] * uVar35 + (long)pd._vptr_ParamDict);
          for (uVar27 = 0; uVar27 != uVar40; uVar27 = uVar27 + 1) {
            lVar18 = uVar27 * 0x24;
            fVar2 = *(float *)(lVar34 + 0x18 + lVar18);
            fVar3 = *(float *)(lVar34 + 0x1c + lVar18);
            fVar4 = *(float *)(lVar34 + 0x20 + lVar18);
            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar18)),
                                    ZEXT416(*(uint *)(lVar34 + 0x10 + lVar18)),0x10);
            auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar18)),
                                    ZEXT416(*(uint *)(lVar34 + 4 + lVar18)),0x10);
            auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar18)),
                                    ZEXT416(*(uint *)(lVar34 + 0x14 + lVar18)),0x10);
            for (lVar18 = 8; lVar18 != 0x38; lVar18 = lVar18 + 0xc) {
              uVar7 = *(ulong *)(&UNK_004c87b8 + lVar18);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar7;
              fVar65 = (float)uVar7;
              auVar91._0_4_ = fVar65 * auVar61._0_4_;
              fVar76 = (float)(uVar7 >> 0x20);
              auVar91._4_4_ = fVar76 * auVar61._4_4_;
              auVar91._8_4_ = auVar61._8_4_ * 0.0;
              auVar91._12_4_ = auVar61._12_4_ * 0.0;
              auVar89 = vshufps_avx(auVar91,auVar91,0xe1);
              fVar5 = *(float *)((long)&DAT_004c87c0 + lVar18);
              auVar92._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
              auVar92._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
              auVar92._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
              auVar92._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
              uVar6 = vmovlps_avx(auVar92);
              *(undefined8 *)((long)&local_180 + lVar18) = uVar6;
              auVar89 = vmovshdup_avx(auVar73);
              *(float *)((long)&pd_5._vptr_ParamDict + lVar18) =
                   auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
            }
            pp_Var41 = pp_Var39;
            for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
              fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc);
              uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc + 4);
              puVar25 = (undefined8 *)((long)&DAT_004c87c0 + 4);
              for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                auVar62._0_4_ = (float)*puVar25 * (float)uVar6;
                auVar62._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                auVar62._8_8_ = 0;
                auVar14 = vmovshdup_avx(auVar62);
                *(float *)((long)pp_Var41 + lVar19 * 4) =
                     auVar62._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
                puVar25 = (undefined8 *)((long)puVar25 + 0xc);
              }
              pp_Var41 = pp_Var41 + 2;
            }
            pp_Var39 = (_func_int **)((long)pp_Var39 + lVar36);
          }
        }
        Mat::create(&this->weight_winograd23_data,(int)((long)((ulong)uVar24 << 0x20 | uVar17) / 8),
                    0x10,(int)uVar33 / 8,0x100,0x40,(Allocator *)0x0);
        iVar42 = (this->weight_winograd23_data).w;
        pvVar10 = (this->weight_winograd23_data).data;
        sVar11 = (this->weight_winograd23_data).elemsize;
        sVar12 = (this->weight_winograd23_data).cstep;
        for (uVar40 = 0; (long)(uVar40 | 7) < (long)uVar29; uVar40 = uVar40 + 8) {
          lVar34 = 0;
          for (lVar36 = 0; lVar36 != 0x10; lVar36 = lVar36 + 1) {
            lVar18 = (long)pvVar10 +
                     (long)iVar42 * sVar11 * lVar36 + (uVar40 >> 3) * sVar12 * sVar11;
            puVar49 = (undefined4 *)
                      (local_e8[0] * (long)local_118 * uVar40 + lVar34 + (long)pd._vptr_ParamDict);
            for (uVar45 = 0; (long)(uVar45 | 7) < lVar26; uVar45 = uVar45 + 8) {
              puVar30 = puVar49;
              for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
                puVar31 = puVar30;
                for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                  *(undefined4 *)(lVar18 + lVar32) = *puVar31;
                  puVar31 = (undefined4 *)((long)puVar31 + local_e8[0] * (long)local_118);
                }
                puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_fc * (long)local_118);
                lVar18 = lVar18 + 0x20;
              }
              puVar49 = puVar49 + (long)iStack_fc * (long)local_118 * 2;
            }
            lVar34 = lVar34 + 4;
          }
        }
        piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar8 == (int *)0x0) goto LAB_00223ac0;
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 != 0) goto LAB_00223ac0;
        pp_Var39 = pd._vptr_ParamDict;
        if (local_108 != (Allocator *)0x0) {
          (*local_108->_vptr_Allocator[3])();
          goto LAB_00223ac0;
        }
        goto LAB_00227bc1;
      }
      local_e8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_118 = SUB168(ZEXT816(0),4);
      local_110 = 0;
      local_108 = (Allocator *)0x0;
      iStack_100 = 0;
      local_f0[0] = 0;
      iStack_fc = pd.d._4_4_;
      sStack_f8 = (size_t)local_118;
      Mat::create((Mat *)&pd,0x24,num_input,uVar33,4,(Allocator *)0x0);
      uVar40 = 0;
      if (0 < (int)num_input) {
        uVar40 = uVar17;
      }
      uVar45 = 0;
      if (0 < (int)uVar33) {
        uVar45 = (ulong)uVar33;
      }
      for (uVar35 = 0; uVar35 != uVar45; uVar35 = uVar35 + 1) {
        lVar34 = (long)(int)(num_input * 9 * (int)uVar35) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        lVar36 = (long)iStack_fc * (long)local_118;
        pp_Var39 = (_func_int **)((long)local_118 * local_e8[0] * uVar35 + (long)pd._vptr_ParamDict)
        ;
        for (uVar27 = 0; uVar27 != uVar40; uVar27 = uVar27 + 1) {
          lVar18 = uVar27 * 0x24;
          fVar2 = *(float *)(lVar34 + 0x18 + lVar18);
          fVar3 = *(float *)(lVar34 + 0x1c + lVar18);
          fVar4 = *(float *)(lVar34 + 0x20 + lVar18);
          auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar18)),
                                  ZEXT416(*(uint *)(lVar34 + 0x10 + lVar18)),0x10);
          auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar34 + 4 + lVar18)),0x10);
          auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar18)),
                                  ZEXT416(*(uint *)(lVar34 + 0x14 + lVar18)),0x10);
          for (lVar18 = 8; lVar18 != 0x50; lVar18 = lVar18 + 0xc) {
            uVar7 = *(ulong *)(&UNK_004c8768 + lVar18);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar7;
            fVar65 = (float)uVar7;
            auVar89._0_4_ = fVar65 * auVar61._0_4_;
            fVar76 = (float)(uVar7 >> 0x20);
            auVar89._4_4_ = fVar76 * auVar61._4_4_;
            auVar89._8_4_ = auVar61._8_4_ * 0.0;
            auVar89._12_4_ = auVar61._12_4_ * 0.0;
            auVar89 = vshufps_avx(auVar89,auVar89,0xe1);
            fVar5 = *(float *)((long)&DAT_004c8770 + lVar18);
            auVar90._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
            auVar90._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
            auVar90._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
            auVar90._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
            uVar6 = vmovlps_avx(auVar90);
            *(undefined8 *)((long)&local_180 + lVar18) = uVar6;
            auVar89 = vmovshdup_avx(auVar72);
            *(float *)((long)&pd_5._vptr_ParamDict + lVar18) =
                 auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
          }
          pp_Var41 = pp_Var39;
          for (lVar18 = 0; lVar18 != 6; lVar18 = lVar18 + 1) {
            fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc);
            uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc + 4);
            puVar25 = (undefined8 *)((long)&DAT_004c8770 + 4);
            for (lVar19 = 0; lVar19 != 6; lVar19 = lVar19 + 1) {
              auVar61._0_4_ = (float)*puVar25 * (float)uVar6;
              auVar61._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar61._8_8_ = 0;
              auVar14 = vmovshdup_avx(auVar61);
              *(float *)((long)pp_Var41 + lVar19 * 4) =
                   auVar61._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
              puVar25 = (undefined8 *)((long)puVar25 + 0xc);
            }
            pp_Var41 = pp_Var41 + 3;
          }
          pp_Var39 = (_func_int **)((long)pp_Var39 + lVar36);
        }
      }
      Mat::create(&this->weight_winograd43_data,(int)((long)((ulong)uVar24 << 0x20 | uVar17) / 8),
                  0x24,(int)uVar33 / 8,0x100,0x40,(Allocator *)0x0);
      iVar42 = (this->weight_winograd43_data).w;
      pvVar10 = (this->weight_winograd43_data).data;
      sVar11 = (this->weight_winograd43_data).elemsize;
      sVar12 = (this->weight_winograd43_data).cstep;
      for (uVar40 = 0; (long)(uVar40 | 7) < (long)uVar29; uVar40 = uVar40 + 8) {
        lVar34 = 0;
        for (lVar36 = 0; lVar36 != 0x24; lVar36 = lVar36 + 1) {
          lVar18 = (long)pvVar10 + (long)iVar42 * sVar11 * lVar36 + (uVar40 >> 3) * sVar12 * sVar11;
          puVar49 = (undefined4 *)
                    (local_e8[0] * (long)local_118 * uVar40 + lVar34 + (long)pd._vptr_ParamDict);
          for (uVar45 = 0; (long)(uVar45 | 7) < lVar26; uVar45 = uVar45 + 8) {
            puVar30 = puVar49;
            for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
              puVar31 = puVar30;
              for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                *(undefined4 *)(lVar18 + lVar32) = *puVar31;
                puVar31 = (undefined4 *)((long)puVar31 + local_e8[0] * (long)local_118);
              }
              puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_fc * (long)local_118);
              lVar18 = lVar18 + 0x20;
            }
            puVar49 = puVar49 + (long)iStack_fc * (long)local_118 * 2;
          }
          lVar34 = lVar34 + 4;
        }
      }
      piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pp_Var39 = pd._vptr_ParamDict;
          if (local_108 == (Allocator *)0x0) goto LAB_00227bc1;
          (*local_108->_vptr_Allocator[3])();
        }
      }
    }
    else {
      cVar23 = opt->use_winograd63_convolution;
      bVar21 = 0xf < num_input;
      if (((bool)cVar23 != true) || (num_input < 0x10)) goto LAB_00226d5a;
      bVar21 = true;
      if (0x30 < uVar33 - 0x10) {
        cVar23 = '\x01';
        goto LAB_00226d5a;
      }
      cVar23 = '\x01';
      if (0x40 < num_input) goto LAB_00226d5a;
LAB_002272be:
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      uVar45 = 0;
      Mat::create((Mat *)&pd_5,0x40,num_input,uVar33,4,(Allocator *)0x0);
      local_180 = &this->weight_winograd63_data;
      uVar40 = 0;
      if (0 < (int)num_input) {
        uVar40 = uVar17;
      }
      uVar35 = 0;
      if (0 < (int)uVar33) {
        uVar35 = (ulong)uVar33;
      }
      for (; uVar45 != uVar35; uVar45 = uVar45 + 1) {
        lVar34 = (long)(int)(num_input * 9 * (int)uVar45) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        for (uVar27 = 0; uVar27 != uVar40; uVar27 = uVar27 + 1) {
          lVar36 = uVar27 * 0x24;
          fVar2 = *(float *)(lVar34 + 0x18 + lVar36);
          fVar3 = *(float *)(lVar34 + 0x1c + lVar36);
          fVar4 = *(float *)(lVar34 + 0x20 + lVar36);
          auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar36)),
                                  ZEXT416(*(uint *)(lVar34 + 0x10 + lVar36)),0x10);
          auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar36)),
                                  ZEXT416(*(uint *)(lVar34 + 4 + lVar36)),0x10);
          auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar36)),
                                  ZEXT416(*(uint *)(lVar34 + 0x14 + lVar36)),0x10);
          for (lVar36 = 8; lVar36 != 0x68; lVar36 = lVar36 + 0xc) {
            uVar7 = *(ulong *)("N4ncnn19Convolution_x86_avxE" + lVar36 + 0x18);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = uVar7;
            fVar65 = (float)uVar7;
            auVar93._0_4_ = fVar65 * auVar61._0_4_;
            fVar76 = (float)(uVar7 >> 0x20);
            auVar93._4_4_ = fVar76 * auVar61._4_4_;
            auVar93._8_4_ = auVar61._8_4_ * 0.0;
            auVar93._12_4_ = auVar61._12_4_ * 0.0;
            auVar89 = vshufps_avx(auVar93,auVar93,0xe1);
            fVar5 = *(float *)((long)&DAT_004c8710 + lVar36);
            auVar94._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
            auVar94._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
            auVar94._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
            auVar94._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
            uVar6 = vmovlps_avx(auVar94);
            *(undefined8 *)((long)&uStack_130 + lVar36) = uVar6;
            auVar89 = vmovshdup_avx(auVar74);
            *(float *)((long)&pd._vptr_ParamDict + lVar36) =
                 auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
          }
          pp_Var39 = pd_5._vptr_ParamDict;
          for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
            fVar2 = *(float *)((long)&pd._vptr_ParamDict + lVar36 * 0xc);
            uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar36 * 0xc + 4);
            puVar25 = (undefined8 *)((long)&DAT_004c8710 + 4);
            for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
              auVar63._0_4_ = (float)*puVar25 * (float)uVar6;
              auVar63._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar63._8_8_ = 0;
              auVar14 = vmovshdup_avx(auVar63);
              *(float *)((long)pp_Var39 + lVar18 * 4) =
                   auVar63._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
              puVar25 = (undefined8 *)((long)puVar25 + 0xc);
            }
            pp_Var39 = pp_Var39 + 4;
          }
        }
      }
      Mat::create(local_180,(int)((long)((ulong)uVar24 << 0x20 | uVar17) / 8),0x40,(int)uVar33 / 8,
                  0x100,0x40,(Allocator *)0x0);
      iVar42 = (this->weight_winograd63_data).w;
      pvVar10 = (this->weight_winograd63_data).data;
      sVar11 = (this->weight_winograd63_data).elemsize;
      sVar12 = (this->weight_winograd63_data).cstep;
      for (uVar40 = 0; (long)(uVar40 | 7) < (long)uVar29; uVar40 = uVar40 + 8) {
        lVar34 = 0;
        for (lVar36 = 0; lVar36 != 0x40; lVar36 = lVar36 + 1) {
          lVar18 = (long)pvVar10 + (long)iVar42 * sVar11 * lVar36 + (uVar40 >> 3) * sVar12 * sVar11;
          for (uVar45 = 0; (long)(uVar45 | 7) < lVar26; uVar45 = uVar45 + 8) {
            for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
              for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                *(undefined4 *)(lVar18 + lVar32) =
                     *(undefined4 *)(lVar34 + (long)pd_5._vptr_ParamDict);
              }
              lVar18 = lVar18 + 0x20;
            }
          }
          lVar34 = lVar34 + 4;
        }
      }
      piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        pp_Var39 = pd_5._vptr_ParamDict;
        if (*piVar8 == 0) {
LAB_00227bc1:
          free(pp_Var39);
        }
      }
    }
LAB_00223ac0:
    bVar51 = (uVar28 & 3) == 0;
    bVar52 = (uVar28 & 7) != 0;
    bVar21 = bVar52 && bVar51;
    if (((uVar33 & 7) == 0) && (bVar52 && bVar51)) {
      p_Var46 = this->_vptr_Convolution_x86_avx[-3];
      iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (((iVar42 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)
                  ))) || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) ==
                            1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                          (long)p_Var46) == 1)) &&
                          ((*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var46 + 4)) == 2 &&
                           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) ==
                            2)))))))) {
        iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar42 = 1;
        iVar38 = 1;
LAB_00223dff:
        convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
      }
      else {
        iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
        if (opt->use_sgemm_convolution == true) goto LAB_00223dff;
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,num_input,iVar22,iVar42,iVar38,4,8);
      }
      bVar21 = true;
      bVar53 = false;
    }
    else {
      bVar53 = (uVar28 & 3) != 0;
      if (((uVar33 & 7) == 0) && ((bool)bVar53)) {
        p_Var46 = this->_vptr_Convolution_x86_avx[-3];
        iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
        if (iVar42 == 3) {
          if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
             (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)) &&
              (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
               ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 2 ||
                (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 2))))))))
          goto LAB_002243d5;
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_data_tm,num_input,
                     *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),3,3,1,8);
        }
        else {
          if (((iVar42 != 1) ||
              (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 1)) ||
             (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
               (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1))
                || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)))) &&
              ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 2))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 2)))))) {
LAB_002243d5:
            pMVar47 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
            iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
            if (opt->use_sgemm_convolution == true) {
              convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                        (pMVar47,&this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
            }
            else {
              convolution_transform_kernel_packed_sse
                        (pMVar47,&this->weight_data_tm,num_input,iVar22,iVar42,iVar38,1,8);
            }
            bVar53 = true;
            goto LAB_00224428;
          }
          convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_sgemm_data,num_input,
                     *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),1,1);
        }
        bVar53 = true;
      }
    }
LAB_00224428:
    bVar52 = (uVar29 & 3) == 0;
    bVar54 = (uVar33 & 7) != 0;
    bVar51 = bVar54 && bVar52;
    if (((uVar28 & 7) != 0) || (!bVar54 || !bVar52)) goto LAB_00223f94;
    p_Var46 = this->_vptr_Convolution_x86_avx[-3];
    iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
    if (((iVar42 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1))
       && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
            (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
            ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),1,1);
      bVar52 = false;
    }
    else {
      pMVar47 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
      iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
      if (opt->use_sgemm_convolution == true) {
        convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                  (pMVar47,&this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
      }
      else {
        convolution_transform_kernel_packed_sse
                  (pMVar47,&this->weight_data_tm,num_input,iVar22,iVar42,iVar38,8,4);
      }
      bVar52 = false;
    }
LAB_00224550:
    if ((bVar21) && (bVar51 != false)) {
      p_Var46 = this->_vptr_Convolution_x86_avx[-3];
      iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (((iVar42 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1))
                || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1))
                     && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4))
                         == 2)) &&
                    (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2))))))
      {
        iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar42 = 1;
        iVar38 = iVar42;
LAB_0022479f:
        convolution_im2col_sgemm_transform_kernel_pack4_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
      }
      else {
        if (opt->use_winograd_convolution == true) {
          bVar50 = opt->use_winograd23_convolution;
          if ((bVar50 == false) && (opt->use_winograd43_convolution == false)) {
            if ((iVar42 == 3) && (opt->use_winograd63_convolution != false)) {
LAB_0022464d:
              if (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 3) &&
                  (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                    (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1
                   )))) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) ==
                            1)) {
                bVar54 = opt->use_winograd63_convolution;
                if (((bVar54 != true) || ((int)num_input < 8)) ||
                   ((uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),
                    0x18 < uVar33 - 8 || (0x20 < num_input)))) {
                  if (opt->use_winograd43_convolution != false) {
                    if ((int)num_input < 8) {
                      if (bVar50 == false && bVar54 == false) {
                        uVar28 = (ulong)*(uint *)((long)&(this->weight_winograd23_data).h +
                                                 (long)p_Var46);
                        goto LAB_00227645;
                      }
                    }
                    else {
                      uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
                      uVar28 = (ulong)uVar33;
                      if (((bVar50 | bVar54) != 1) || (7 < (int)uVar33)) {
LAB_00227645:
                        local_e8[0] = 0;
                        pd._vptr_ParamDict = (_func_int **)0x0;
                        pd.d._0_4_ = 0;
                        pd.d._4_4_ = 0;
                        local_118 = SUB168(ZEXT816(0),4);
                        local_110 = 0;
                        local_108 = (Allocator *)0x0;
                        iStack_100 = 0;
                        local_f0[0] = 0;
                        uVar40 = 0;
                        iVar42 = (int)uVar28;
                        iStack_fc = pd.d._4_4_;
                        sStack_f8 = (size_t)local_118;
                        Mat::create((Mat *)&pd,0x24,num_input,iVar42,4,(Allocator *)0x0);
                        uVar29 = 0;
                        if (0 < (int)num_input) {
                          uVar29 = uVar17;
                        }
                        local_180 = (Mat *)CONCAT44(local_180._4_4_,iVar42);
                        uVar45 = 0;
                        if (0 < iVar42) {
                          uVar45 = uVar28;
                        }
                        for (; uVar40 != uVar45; uVar40 = uVar40 + 1) {
                          lVar34 = (long)(int)(num_input * 9 * (int)uVar40) * 4 +
                                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46
                                            );
                          lVar36 = (long)iStack_fc * (long)local_118;
                          pp_Var39 = (_func_int **)
                                     ((long)local_118 * local_e8[0] * uVar40 +
                                     (long)pd._vptr_ParamDict);
                          for (uVar28 = 0; uVar28 != uVar29; uVar28 = uVar28 + 1) {
                            lVar18 = uVar28 * 0x24;
                            fVar2 = *(float *)(lVar34 + 0x18 + lVar18);
                            fVar3 = *(float *)(lVar34 + 0x1c + lVar18);
                            fVar4 = *(float *)(lVar34 + 0x20 + lVar18);
                            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar18)),
                                                    ZEXT416(*(uint *)(lVar34 + 0x10 + lVar18)),0x10)
                            ;
                            auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar18)),
                                                    ZEXT416(*(uint *)(lVar34 + 4 + lVar18)),0x10);
                            auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar18)),
                                                    ZEXT416(*(uint *)(lVar34 + 0x14 + lVar18)),0x10)
                            ;
                            for (lVar18 = 8; lVar18 != 0x50; lVar18 = lVar18 + 0xc) {
                              uVar35 = *(ulong *)(&UNK_004c8768 + lVar18);
                              auVar75._8_8_ = 0;
                              auVar75._0_8_ = uVar35;
                              fVar65 = (float)uVar35;
                              auVar95._0_4_ = fVar65 * auVar61._0_4_;
                              fVar76 = (float)(uVar35 >> 0x20);
                              auVar95._4_4_ = fVar76 * auVar61._4_4_;
                              auVar95._8_4_ = auVar61._8_4_ * 0.0;
                              auVar95._12_4_ = auVar61._12_4_ * 0.0;
                              auVar89 = vshufps_avx(auVar95,auVar95,0xe1);
                              fVar5 = *(float *)((long)&DAT_004c8770 + lVar18);
                              auVar96._0_4_ =
                                   fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
                              auVar96._4_4_ =
                                   fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
                              auVar96._8_4_ =
                                   auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
                              auVar96._12_4_ =
                                   auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
                              uVar6 = vmovlps_avx(auVar96);
                              *(undefined8 *)((long)&local_180 + lVar18) = uVar6;
                              auVar89 = vmovshdup_avx(auVar75);
                              *(float *)((long)&pd_5._vptr_ParamDict + lVar18) =
                                   auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
                            }
                            pp_Var41 = pp_Var39;
                            for (lVar18 = 0; lVar18 != 6; lVar18 = lVar18 + 1) {
                              fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc);
                              uVar6 = *(undefined8 *)
                                       ((long)&pd_5._vptr_ParamDict + lVar18 * 0xc + 4);
                              puVar25 = (undefined8 *)((long)&DAT_004c8770 + 4);
                              for (lVar19 = 0; lVar19 != 6; lVar19 = lVar19 + 1) {
                                auVar64._0_4_ = (float)*puVar25 * (float)uVar6;
                                auVar64._4_4_ =
                                     (float)((ulong)*puVar25 >> 0x20) *
                                     (float)((ulong)uVar6 >> 0x20);
                                auVar64._8_8_ = 0;
                                auVar14 = vmovshdup_avx(auVar64);
                                *(float *)((long)pp_Var41 + lVar19 * 4) =
                                     auVar64._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) +
                                     auVar14._0_4_;
                                puVar25 = (undefined8 *)((long)puVar25 + 0xc);
                              }
                              pp_Var41 = pp_Var41 + 3;
                            }
                            pp_Var39 = (_func_int **)((long)pp_Var39 + lVar36);
                          }
                        }
                        Mat::create(&this->weight_winograd43_data,
                                    (int)((long)((ulong)uVar24 << 0x20 | uVar17) / 4),0x24,
                                    iVar42 / 4,0x40,0x10,(Allocator *)0x0);
                        iVar22 = (this->weight_winograd43_data).w;
                        pvVar10 = (this->weight_winograd43_data).data;
                        sVar11 = (this->weight_winograd43_data).elemsize;
                        sVar12 = (this->weight_winograd43_data).cstep;
                        for (uVar28 = 0; (long)(uVar28 | 3) < (long)iVar42; uVar28 = uVar28 + 4) {
                          lVar34 = 0;
                          for (lVar36 = 0; lVar36 != 0x24; lVar36 = lVar36 + 1) {
                            lVar18 = (long)pvVar10 +
                                     (long)iVar22 * sVar11 * lVar36 +
                                     (uVar28 >> 2) * sVar12 * sVar11;
                            puVar49 = (undefined4 *)
                                      (local_e8[0] * (long)local_118 * uVar28 + lVar34 +
                                      (long)pd._vptr_ParamDict);
                            for (uVar29 = 0; (long)(uVar29 | 3) < lVar26; uVar29 = uVar29 + 4) {
                              puVar30 = puVar49;
                              for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                                puVar31 = puVar30;
                                for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 4) {
                                  *(undefined4 *)(lVar18 + lVar32) = *puVar31;
                                  puVar31 = (undefined4 *)
                                            ((long)puVar31 + local_e8[0] * (long)local_118);
                                }
                                puVar30 = (undefined4 *)
                                          ((long)puVar30 + (long)iStack_fc * (long)local_118);
                                lVar18 = lVar18 + 0x10;
                              }
                              puVar49 = puVar49 + (long)iStack_fc * (long)local_118;
                            }
                            lVar34 = lVar34 + 4;
                          }
                        }
                        piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
                        if (piVar8 != (int *)0x0) {
                          LOCK();
                          *piVar8 = *piVar8 + -1;
                          UNLOCK();
                          if (*piVar8 == 0) {
                            if (local_108 == (Allocator *)0x0) {
                              free(pd._vptr_ParamDict);
                            }
                            else {
                              (*local_108->_vptr_Allocator[3])();
                            }
                          }
                        }
                        goto LAB_002247f5;
                      }
                    }
LAB_002269ba:
                    uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
                    local_e8[0] = 0;
                    pd._vptr_ParamDict = (_func_int **)0x0;
                    pd.d._0_4_ = 0;
                    pd.d._4_4_ = 0;
                    local_118 = SUB168(ZEXT816(0),4);
                    local_110 = 0;
                    local_108 = (Allocator *)0x0;
                    iStack_100 = 0;
                    local_f0[0] = 0;
                    uVar29 = 0;
                    iStack_fc = pd.d._4_4_;
                    sStack_f8 = (size_t)local_118;
                    Mat::create((Mat *)&pd,0x10,num_input,uVar33,4,(Allocator *)0x0);
                    uVar28 = 0;
                    if (0 < (int)num_input) {
                      uVar28 = uVar17;
                    }
                    local_180 = (Mat *)CONCAT44(local_180._4_4_,uVar33);
                    uVar40 = 0;
                    if (0 < (int)uVar33) {
                      uVar40 = (ulong)uVar33;
                    }
                    for (; uVar29 != uVar40; uVar29 = uVar29 + 1) {
                      lVar34 = (long)(int)(num_input * 9 * (int)uVar29) * 4 +
                               *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
                      lVar36 = (long)iStack_fc * (long)local_118;
                      pp_Var39 = (_func_int **)
                                 ((long)local_118 * local_e8[0] * uVar29 + (long)pd._vptr_ParamDict)
                      ;
                      for (uVar45 = 0; uVar45 != uVar28; uVar45 = uVar45 + 1) {
                        lVar18 = uVar45 * 0x24;
                        fVar2 = *(float *)(lVar34 + 0x18 + lVar18);
                        fVar3 = *(float *)(lVar34 + 0x1c + lVar18);
                        fVar4 = *(float *)(lVar34 + 0x20 + lVar18);
                        auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar18)),
                                                ZEXT416(*(uint *)(lVar34 + 0x10 + lVar18)),0x10);
                        auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar18)),
                                                ZEXT416(*(uint *)(lVar34 + 4 + lVar18)),0x10);
                        auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar18)),
                                                ZEXT416(*(uint *)(lVar34 + 0x14 + lVar18)),0x10);
                        for (lVar18 = 8; lVar18 != 0x38; lVar18 = lVar18 + 0xc) {
                          uVar35 = *(ulong *)(&UNK_004c87b8 + lVar18);
                          auVar71._8_8_ = 0;
                          auVar71._0_8_ = uVar35;
                          fVar65 = (float)uVar35;
                          auVar87._0_4_ = fVar65 * auVar61._0_4_;
                          fVar76 = (float)(uVar35 >> 0x20);
                          auVar87._4_4_ = fVar76 * auVar61._4_4_;
                          auVar87._8_4_ = auVar61._8_4_ * 0.0;
                          auVar87._12_4_ = auVar61._12_4_ * 0.0;
                          auVar89 = vshufps_avx(auVar87,auVar87,0xe1);
                          fVar5 = *(float *)((long)&DAT_004c87c0 + lVar18);
                          auVar88._0_4_ =
                               fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
                          auVar88._4_4_ =
                               fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
                          auVar88._8_4_ =
                               auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
                          auVar88._12_4_ =
                               auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
                          uVar6 = vmovlps_avx(auVar88);
                          *(undefined8 *)((long)&local_180 + lVar18) = uVar6;
                          auVar89 = vmovshdup_avx(auVar71);
                          *(float *)((long)&pd_5._vptr_ParamDict + lVar18) =
                               auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
                        }
                        pp_Var41 = pp_Var39;
                        for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                          fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc);
                          uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc + 4);
                          puVar25 = (undefined8 *)((long)&DAT_004c87c0 + 4);
                          for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                            auVar60._0_4_ = (float)*puVar25 * (float)uVar6;
                            auVar60._4_4_ =
                                 (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                            auVar60._8_8_ = 0;
                            auVar14 = vmovshdup_avx(auVar60);
                            *(float *)((long)pp_Var41 + lVar19 * 4) =
                                 auVar60._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) +
                                 auVar14._0_4_;
                            puVar25 = (undefined8 *)((long)puVar25 + 0xc);
                          }
                          pp_Var41 = pp_Var41 + 2;
                        }
                        pp_Var39 = (_func_int **)((long)pp_Var39 + lVar36);
                      }
                    }
                    Mat::create(&this->weight_winograd23_data,
                                (int)((long)((ulong)uVar24 << 0x20 | uVar17) / 4),0x10,
                                (int)uVar33 / 4,0x40,0x10,(Allocator *)0x0);
                    iVar42 = (this->weight_winograd23_data).w;
                    pvVar10 = (this->weight_winograd23_data).data;
                    sVar11 = (this->weight_winograd23_data).elemsize;
                    sVar12 = (this->weight_winograd23_data).cstep;
                    for (uVar28 = 0; (long)(uVar28 | 3) < (long)(int)uVar33; uVar28 = uVar28 + 4) {
                      lVar34 = 0;
                      for (lVar36 = 0; lVar36 != 0x10; lVar36 = lVar36 + 1) {
                        lVar18 = (long)pvVar10 +
                                 (long)iVar42 * sVar11 * lVar36 + (uVar28 >> 2) * sVar12 * sVar11;
                        puVar49 = (undefined4 *)
                                  (local_e8[0] * (long)local_118 * uVar28 + lVar34 +
                                  (long)pd._vptr_ParamDict);
                        for (uVar29 = 0; (long)(uVar29 | 3) < lVar26; uVar29 = uVar29 + 4) {
                          puVar30 = puVar49;
                          for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                            puVar31 = puVar30;
                            for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 4) {
                              *(undefined4 *)(lVar18 + lVar32) = *puVar31;
                              puVar31 = (undefined4 *)
                                        ((long)puVar31 + local_e8[0] * (long)local_118);
                            }
                            puVar30 = (undefined4 *)
                                      ((long)puVar30 + (long)iStack_fc * (long)local_118);
                            lVar18 = lVar18 + 0x10;
                          }
                          puVar49 = puVar49 + (long)iStack_fc * (long)local_118;
                        }
                        lVar34 = lVar34 + 4;
                      }
                    }
                    piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (local_108 == (Allocator *)0x0) {
                          free(pd._vptr_ParamDict);
                        }
                        else {
                          (*local_108->_vptr_Allocator[3])();
                        }
                      }
                    }
                    goto LAB_002247f5;
                  }
                  if (bVar50 != false) goto LAB_002269ba;
                  uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
                }
                pd_5._vptr_ParamDict = (_func_int **)0x0;
                pd_5.d._0_4_ = 0;
                pd_5.d._4_4_ = 0;
                pMVar47 = (Mat *)0x0;
                Mat::create((Mat *)&pd_5,0x40,num_input,uVar33,4,(Allocator *)0x0);
                uVar28 = 0;
                if (0 < (int)num_input) {
                  uVar28 = uVar17;
                }
                pMVar20 = (Mat *)0x0;
                if (0 < (int)uVar33) {
                  pMVar20 = (Mat *)(ulong)uVar33;
                }
                for (; pMVar47 != pMVar20; pMVar47 = (Mat *)((long)&pMVar47->data + 1)) {
                  lVar34 = (long)(int)(num_input * 9 * (int)pMVar47) * 4 +
                           *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
                  for (uVar29 = 0; uVar29 != uVar28; uVar29 = uVar29 + 1) {
                    lVar36 = uVar29 * 0x24;
                    fVar2 = *(float *)(lVar34 + 0x18 + lVar36);
                    fVar3 = *(float *)(lVar34 + 0x1c + lVar36);
                    fVar4 = *(float *)(lVar34 + 0x20 + lVar36);
                    auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar36)),
                                            ZEXT416(*(uint *)(lVar34 + 0x10 + lVar36)),0x10);
                    auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar36)),
                                            ZEXT416(*(uint *)(lVar34 + 4 + lVar36)),0x10);
                    auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar36)),
                                            ZEXT416(*(uint *)(lVar34 + 0x14 + lVar36)),0x10);
                    for (lVar36 = 8; lVar36 != 0x68; lVar36 = lVar36 + 0xc) {
                      uVar40 = *(ulong *)("N4ncnn19Convolution_x86_avxE" + lVar36 + 0x18);
                      auVar70._8_8_ = 0;
                      auVar70._0_8_ = uVar40;
                      fVar65 = (float)uVar40;
                      auVar85._0_4_ = fVar65 * auVar61._0_4_;
                      fVar76 = (float)(uVar40 >> 0x20);
                      auVar85._4_4_ = fVar76 * auVar61._4_4_;
                      auVar85._8_4_ = auVar61._8_4_ * 0.0;
                      auVar85._12_4_ = auVar61._12_4_ * 0.0;
                      auVar89 = vshufps_avx(auVar85,auVar85,0xe1);
                      fVar5 = *(float *)((long)&DAT_004c8710 + lVar36);
                      auVar86._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_
                      ;
                      auVar86._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_
                      ;
                      auVar86._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
                      auVar86._12_4_ =
                           auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
                      uVar6 = vmovlps_avx(auVar86);
                      *(undefined8 *)((long)&uStack_130 + lVar36) = uVar6;
                      auVar89 = vmovshdup_avx(auVar70);
                      *(float *)((long)&pd._vptr_ParamDict + lVar36) =
                           auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
                    }
                    pp_Var39 = pd_5._vptr_ParamDict;
                    for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                      fVar2 = *(float *)((long)&pd._vptr_ParamDict + lVar36 * 0xc);
                      uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar36 * 0xc + 4);
                      puVar25 = (undefined8 *)((long)&DAT_004c8710 + 4);
                      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
                        auVar59._0_4_ = (float)*puVar25 * (float)uVar6;
                        auVar59._4_4_ =
                             (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                        auVar59._8_8_ = 0;
                        auVar14 = vmovshdup_avx(auVar59);
                        *(float *)((long)pp_Var39 + lVar18 * 4) =
                             auVar59._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
                        puVar25 = (undefined8 *)((long)puVar25 + 0xc);
                      }
                      pp_Var39 = pp_Var39 + 4;
                    }
                  }
                }
                local_180 = (Mat *)(ulong)uVar33;
                Mat::create(&this->weight_winograd63_data,
                            (int)((long)((ulong)uVar24 << 0x20 | uVar17) / 4),0x40,(int)uVar33 / 4,
                            0x40,0x10,(Allocator *)0x0);
                iVar42 = (this->weight_winograd63_data).w;
                pvVar10 = (this->weight_winograd63_data).data;
                sVar11 = (this->weight_winograd63_data).elemsize;
                sVar12 = (this->weight_winograd63_data).cstep;
                for (uVar28 = 0; (long)(uVar28 | 3) < (long)(int)uVar33; uVar28 = uVar28 + 4) {
                  lVar34 = 0;
                  for (lVar36 = 0; lVar36 != 0x40; lVar36 = lVar36 + 1) {
                    lVar18 = (long)pvVar10 +
                             (long)iVar42 * sVar11 * lVar36 + (uVar28 >> 2) * sVar12 * sVar11;
                    for (uVar29 = 0; (long)(uVar29 | 3) < lVar26; uVar29 = uVar29 + 4) {
                      for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                        for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 4) {
                          *(undefined4 *)(lVar18 + lVar32) =
                               *(undefined4 *)(lVar34 + (long)pd_5._vptr_ParamDict);
                        }
                        lVar18 = lVar18 + 0x10;
                      }
                    }
                    lVar34 = lVar34 + 4;
                  }
                }
                piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
                if (piVar8 != (int *)0x0) {
                  LOCK();
                  *piVar8 = *piVar8 + -1;
                  UNLOCK();
                  if (*piVar8 == 0) {
                    free(pd_5._vptr_ParamDict);
                  }
                }
                goto LAB_002247f5;
              }
            }
          }
          else if (iVar42 == 3) goto LAB_0022464d;
        }
        iVar22 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46);
        if (iVar22 == 1) {
          iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
          if (iVar22 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) &&
                ((0xb < (int)num_input ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46))) &&
                ((0xf < (int)num_input ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46)))))))
            goto LAB_00224767;
          }
          else {
LAB_0022475d:
            if (1 < iVar22) goto LAB_00224762;
          }
        }
        else {
          if (iVar22 < 2) {
            iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
            goto LAB_0022475d;
          }
LAB_00224762:
          if ((int)num_input < 0x10) {
            bVar50 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 0x10;
          }
          else {
LAB_00224767:
            bVar50 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar50)) {
            iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
            goto LAB_0022479f;
          }
        }
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,num_input,
                   *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),iVar42,
                   *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46),4,4);
      }
    }
LAB_002247f5:
    if ((bVar51 & bVar53) == 1) {
      p_Var46 = this->_vptr_Convolution_x86_avx[-3];
      iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (iVar42 == 3) {
        if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 2))))))))
        goto LAB_00224924;
        iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar42 = 3;
        iVar38 = iVar42;
      }
      else {
        if (((iVar42 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
          iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar42 = 1;
          iVar38 = iVar42;
LAB_002249c1:
          convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
          goto LAB_00224a05;
        }
LAB_00224924:
        iVar22 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46);
        if (iVar22 == 1) {
          iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
          if (iVar22 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) &&
                ((0xb < (int)num_input ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46))) &&
                ((0xf < (int)num_input ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46)))))))
            goto LAB_0022498c;
          }
          else {
LAB_00224982:
            if (1 < iVar22) goto LAB_00224987;
          }
        }
        else {
          if (iVar22 < 2) {
            iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
            goto LAB_00224982;
          }
LAB_00224987:
          if ((int)num_input < 0x10) {
            bVar50 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 0x10;
          }
          else {
LAB_0022498c:
            bVar50 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar50)) {
            iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
            goto LAB_002249c1;
          }
        }
        iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_data_tm,num_input,iVar22,iVar42,iVar38,1,4);
    }
  }
LAB_00224a05:
  uVar6 = local_58;
  if ((bVar21) && (bVar52 != false)) {
    p_Var46 = this->_vptr_Convolution_x86_avx[-3];
    iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
    if (((iVar42 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1))
       && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
      iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar42 = 1;
      iVar38 = iVar42;
LAB_00224dec:
      convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
      uVar6 = local_58;
    }
    else if (((opt->use_winograd_convolution == true) && (iVar42 == 3)) &&
            (((opt->use_winograd63_convolution != false &&
              (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 3 &&
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)))) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))))) {
      uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      uVar29 = 0;
      Mat::create((Mat *)&pd_5,0x40,num_input,uVar33,4,(Allocator *)0x0);
      local_68 = (long)(int)uVar33;
      uVar28 = 0;
      if (0 < (int)num_input) {
        uVar28 = uVar17;
      }
      uVar40 = 0;
      if (0 < (int)uVar33) {
        uVar40 = (ulong)uVar33;
      }
      for (; uVar29 != uVar40; uVar29 = uVar29 + 1) {
        lVar34 = (long)(int)(num_input * 9 * (int)uVar29) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        for (uVar45 = 0; uVar45 != uVar28; uVar45 = uVar45 + 1) {
          lVar36 = uVar45 * 0x24;
          fVar2 = *(float *)(lVar34 + 0x18 + lVar36);
          fVar3 = *(float *)(lVar34 + 0x1c + lVar36);
          fVar4 = *(float *)(lVar34 + 0x20 + lVar36);
          auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar36)),
                                  ZEXT416(*(uint *)(lVar34 + 0x10 + lVar36)),0x10);
          auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar36)),
                                  ZEXT416(*(uint *)(lVar34 + 4 + lVar36)),0x10);
          auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar36)),
                                  ZEXT416(*(uint *)(lVar34 + 0x14 + lVar36)),0x10);
          for (lVar36 = 8; lVar36 != 0x68; lVar36 = lVar36 + 0xc) {
            uVar35 = *(ulong *)("N4ncnn19Convolution_x86_avxE" + lVar36 + 0x18);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar35;
            fVar65 = (float)uVar35;
            auVar79._0_4_ = fVar65 * auVar61._0_4_;
            fVar76 = (float)(uVar35 >> 0x20);
            auVar79._4_4_ = fVar76 * auVar61._4_4_;
            auVar79._8_4_ = auVar61._8_4_ * 0.0;
            auVar79._12_4_ = auVar61._12_4_ * 0.0;
            auVar89 = vshufps_avx(auVar79,auVar79,0xe1);
            fVar5 = *(float *)((long)&DAT_004c8710 + lVar36);
            auVar80._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
            auVar80._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
            auVar80._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
            auVar80._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
            uVar6 = vmovlps_avx(auVar80);
            *(undefined8 *)((long)&uStack_130 + lVar36) = uVar6;
            auVar89 = vmovshdup_avx(auVar67);
            *(float *)((long)&pd._vptr_ParamDict + lVar36) =
                 auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
          }
          pp_Var39 = pd_5._vptr_ParamDict;
          for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
            fVar2 = *(float *)((long)&pd._vptr_ParamDict + lVar36 * 0xc);
            uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar36 * 0xc + 4);
            puVar25 = (undefined8 *)((long)&DAT_004c8710 + 4);
            for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
              auVar56._0_4_ = (float)*puVar25 * (float)uVar6;
              auVar56._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar56._8_8_ = 0;
              auVar14 = vmovshdup_avx(auVar56);
              *(float *)((long)pp_Var39 + lVar18 * 4) =
                   auVar56._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
              puVar25 = (undefined8 *)((long)puVar25 + 0xc);
            }
            pp_Var39 = pp_Var39 + 4;
          }
        }
      }
      Mat::create(&this->weight_winograd63_data,num_input,0x40,((int)uVar33 / 4) * -3 + uVar33,0x10,
                  4,(Allocator *)0x0);
      sVar11 = (this->weight_winograd63_data).elemsize;
      local_50 = (this->weight_winograd63_data).cstep * sVar11;
      local_48 = (long)(this->weight_winograd63_data).w * sVar11;
      local_180 = (Mat *)pd_5._vptr_ParamDict;
      local_58 = 0;
      local_60 = (this->weight_winograd63_data).data;
      local_90 = (Mat *)0x0;
      uVar28 = 0;
      while (uVar29 = uVar28, (long)(uVar29 | 3) < local_68) {
        local_40 = (void *)((uVar29 >> 2) * local_50 + (long)local_60);
        lVar34 = 0;
        pMVar47 = local_90;
        while (pMVar20 = pMVar47, lVar36 = lVar34, lVar36 != 0x40) {
          puVar49 = (undefined4 *)(local_48 * lVar36 + (long)local_40);
          for (lVar34 = 3; lVar34 < lVar26; lVar34 = lVar34 + 4) {
            *puVar49 = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[1] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[2] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[3] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[4] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[5] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[6] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[7] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[8] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[9] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[10] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[0xb] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[0xc] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[0xd] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[0xe] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49[0xf] = *(undefined4 *)((long)pd_5._vptr_ParamDict + (long)pMVar20);
            puVar49 = puVar49 + 0x10;
          }
          pMVar47 = (Mat *)((long)&pMVar20->data + 4);
          local_80 = pMVar20;
          local_38 = lVar36;
          lVar34 = lVar36 + 1;
        }
        local_88 = uVar29;
        uVar28 = uVar29 + 4;
      }
      iVar42 = (this->weight_winograd63_data).w;
      pvVar10 = (this->weight_winograd63_data).data;
      sVar11 = (this->weight_winograd63_data).elemsize;
      sVar12 = (this->weight_winograd63_data).cstep;
      uVar28 = uVar29 & 0xffffffff;
      while (uVar40 = uVar29, (long)uVar40 < local_68) {
        pvVar37 = (void *)((ulong)(((uint)uVar28 & 3) + (int)(uVar28 >> 2)) * sVar12 * sVar11 +
                          (long)pvVar10);
        pp_Var39 = pd_5._vptr_ParamDict;
        pp_Var41 = pd_5._vptr_ParamDict;
        pp_Var43 = pd_5._vptr_ParamDict;
        pp_Var48 = pd_5._vptr_ParamDict;
        for (lVar34 = 0; lVar36 = 3, lVar34 != 0x40; lVar34 = lVar34 + 1) {
          for (; lVar36 < lVar26; lVar36 = lVar36 + 4) {
            *(undefined4 *)((long)pvVar37 + lVar36 * 4 + -0xc) = *(undefined4 *)pp_Var41;
            *(undefined4 *)((long)pvVar37 + lVar36 * 4 + -8) = *(undefined4 *)pp_Var43;
            *(undefined4 *)((long)pvVar37 + lVar36 * 4 + -4) = *(undefined4 *)pp_Var39;
            *(undefined4 *)((long)pvVar37 + lVar36 * 4) = *(undefined4 *)pp_Var48;
          }
          pp_Var39 = (_func_int **)((long)pp_Var39 + 4);
          pp_Var43 = (_func_int **)((long)pp_Var43 + 4);
          pp_Var41 = (_func_int **)((long)pp_Var41 + 4);
          pp_Var48 = (_func_int **)((long)pp_Var48 + 4);
          pvVar37 = (void *)((long)pvVar37 + (long)iVar42 * sVar11);
        }
        uVar28 = (ulong)((uint)uVar28 + 1);
        local_88 = uVar40;
        uVar29 = uVar40 + 1;
      }
      piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      uVar6 = 0;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        uVar6 = local_58;
        if (*piVar8 == 0) {
          local_58 = 0;
          free(pd_5._vptr_ParamDict);
          uVar6 = local_58;
        }
      }
    }
    else {
      iVar22 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46);
      if (iVar22 == 1) {
        iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
        if (iVar22 == 1) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) &&
              ((0xb < (int)num_input ||
               (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46))))) ||
             (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) ||
               (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46))) &&
              ((0xf < (int)num_input ||
               (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46)))))))
          goto LAB_00224db4;
        }
        else {
LAB_00224daa:
          if (1 < iVar22) goto LAB_00224daf;
        }
      }
      else {
        if (iVar22 < 2) {
          iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
          goto LAB_00224daa;
        }
LAB_00224daf:
        if ((int)num_input < 0x10) {
          bVar21 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 0x10;
        }
        else {
LAB_00224db4:
          bVar21 = false;
        }
        if ((opt->use_sgemm_convolution == true) && (!bVar21)) {
          iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
          goto LAB_00224dec;
        }
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_data_tm,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),iVar42,
                 *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46),4,1);
      uVar6 = local_58;
    }
  }
  local_58 = uVar6;
  if ((bVar53 & bVar52) != 1) goto LAB_00225247;
  p_Var46 = this->_vptr_Convolution_x86_avx[-3];
  iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
  if (((iVar42 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)) &&
     (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
       (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
      ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
       (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
    iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
    iVar38 = 1;
    iVar42 = iVar38;
  }
  else {
    if (opt->use_winograd_convolution == true) {
      bVar21 = opt->use_winograd23_convolution;
      if (bVar21 == false) {
        if ((iVar42 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_00224f18;
      }
      else if (iVar42 == 3) {
LAB_00224f18:
        if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 3) &&
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) {
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          lVar26 = (long)(int)uVar33;
          if ((opt->use_winograd43_convolution == true) && (0xf < (int)num_input)) {
            if (((int)uVar33 < 0x10 & bVar21) != 0) goto LAB_00225872;
LAB_00224f91:
            local_e8[0] = 0;
            pd._vptr_ParamDict = (_func_int **)0x0;
            pd.d._0_4_ = 0;
            pd.d._4_4_ = 0;
            local_118 = SUB168(ZEXT816(0),4);
            local_110 = 0;
            local_108 = (Allocator *)0x0;
            iStack_100 = 0;
            local_f0[0] = 0;
            uVar29 = 0;
            iStack_fc = pd.d._4_4_;
            sStack_f8 = (size_t)local_118;
            Mat::create((Mat *)&pd,0x24,num_input,uVar33,4,(Allocator *)0x0);
            uVar28 = 0;
            if (0 < (int)num_input) {
              uVar28 = uVar17;
            }
            uVar17 = 0;
            if (0 < (int)uVar33) {
              uVar17 = (ulong)uVar33;
            }
            for (; uVar29 != uVar17; uVar29 = uVar29 + 1) {
              lVar34 = (long)(int)(num_input * 9 * (int)uVar29) * 4 +
                       *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
              lVar36 = (long)iStack_fc * (long)local_118;
              pp_Var39 = (_func_int **)
                         ((long)local_118 * local_e8[0] * uVar29 + (long)pd._vptr_ParamDict);
              for (uVar40 = 0; uVar40 != uVar28; uVar40 = uVar40 + 1) {
                lVar18 = uVar40 * 0x24;
                fVar2 = *(float *)(lVar34 + 0x18 + lVar18);
                fVar3 = *(float *)(lVar34 + 0x1c + lVar18);
                fVar4 = *(float *)(lVar34 + 0x20 + lVar18);
                auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar18)),
                                        ZEXT416(*(uint *)(lVar34 + 0x10 + lVar18)),0x10);
                auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar18)),
                                        ZEXT416(*(uint *)(lVar34 + 4 + lVar18)),0x10);
                auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar18)),
                                        ZEXT416(*(uint *)(lVar34 + 0x14 + lVar18)),0x10);
                for (lVar18 = 8; lVar18 != 0x50; lVar18 = lVar18 + 0xc) {
                  uVar45 = *(ulong *)(&UNK_004c8768 + lVar18);
                  auVar68._8_8_ = 0;
                  auVar68._0_8_ = uVar45;
                  fVar65 = (float)uVar45;
                  auVar81._0_4_ = fVar65 * auVar61._0_4_;
                  fVar76 = (float)(uVar45 >> 0x20);
                  auVar81._4_4_ = fVar76 * auVar61._4_4_;
                  auVar81._8_4_ = auVar61._8_4_ * 0.0;
                  auVar81._12_4_ = auVar61._12_4_ * 0.0;
                  auVar89 = vshufps_avx(auVar81,auVar81,0xe1);
                  fVar5 = *(float *)((long)&DAT_004c8770 + lVar18);
                  auVar82._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
                  auVar82._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
                  auVar82._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
                  auVar82._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
                  uVar6 = vmovlps_avx(auVar82);
                  *(undefined8 *)((long)&local_180 + lVar18) = uVar6;
                  auVar89 = vmovshdup_avx(auVar68);
                  *(float *)((long)&pd_5._vptr_ParamDict + lVar18) =
                       auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
                }
                pp_Var41 = pp_Var39;
                for (lVar18 = 0; lVar18 != 6; lVar18 = lVar18 + 1) {
                  fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc);
                  uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc + 4);
                  puVar25 = (undefined8 *)((long)&DAT_004c8770 + 4);
                  for (lVar19 = 0; lVar19 != 6; lVar19 = lVar19 + 1) {
                    auVar57._0_4_ = (float)*puVar25 * (float)uVar6;
                    auVar57._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20)
                    ;
                    auVar57._8_8_ = 0;
                    auVar14 = vmovshdup_avx(auVar57);
                    *(float *)((long)pp_Var41 + lVar19 * 4) =
                         auVar57._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
                    puVar25 = (undefined8 *)((long)puVar25 + 0xc);
                  }
                  pp_Var41 = pp_Var41 + 3;
                }
                pp_Var39 = (_func_int **)((long)pp_Var39 + lVar36);
              }
            }
            Mat::create(&this->weight_winograd43_data,num_input << 3,0x24,
                        (int)uVar33 / 8 + (int)uVar33 % 4 +
                        (int)(char)((char)((long)(int)uVar33 % 8) / '\x04'),4,(Allocator *)0x0);
            iVar42 = (this->weight_winograd43_data).w;
            pvVar10 = (this->weight_winograd43_data).data;
            sVar11 = (this->weight_winograd43_data).elemsize;
            sVar12 = (this->weight_winograd43_data).cstep;
            for (uVar29 = 0; (long)(uVar29 | 7) < lVar26; uVar29 = uVar29 + 8) {
              lVar34 = 0;
              for (lVar36 = 0; lVar36 != 0x24; lVar36 = lVar36 + 1) {
                lVar18 = (long)pvVar10 +
                         (long)iVar42 * sVar11 * lVar36 + (uVar29 >> 3) * sVar12 * sVar11;
                puVar49 = (undefined4 *)
                          ((long)local_118 * local_e8[0] * uVar29 + lVar34 +
                          (long)pd._vptr_ParamDict);
                for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
                  puVar30 = puVar49;
                  for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 4) {
                    *(undefined4 *)(lVar18 + lVar19) = *puVar30;
                    puVar30 = (undefined4 *)((long)puVar30 + (long)local_118 * local_e8[0]);
                  }
                  puVar49 = (undefined4 *)((long)puVar49 + (long)iStack_fc * (long)local_118);
                  lVar18 = lVar18 + 0x20;
                }
                lVar34 = lVar34 + 4;
              }
            }
            iVar42 = (this->weight_winograd43_data).w;
            pvVar10 = (this->weight_winograd43_data).data;
            sVar11 = (this->weight_winograd43_data).elemsize;
            sVar12 = (this->weight_winograd43_data).cstep;
            for (; (long)(uVar29 | 3) < lVar26; uVar29 = uVar29 + 4) {
              lVar34 = 0;
              for (lVar36 = 0; lVar36 != 0x24; lVar36 = lVar36 + 1) {
                lVar18 = (long)pvVar10 +
                         (long)iVar42 * sVar11 * lVar36 +
                         (ulong)(((uint)(uVar29 >> 3) & 0x1fffffff) +
                                (uint)(((uint)uVar29 >> 2 & 1) != 0)) * sVar12 * sVar11;
                puVar49 = (undefined4 *)
                          ((long)local_118 * local_e8[0] * uVar29 + lVar34 +
                          (long)pd._vptr_ParamDict);
                for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
                  puVar30 = puVar49;
                  for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 4) {
                    *(undefined4 *)(lVar18 + lVar19) = *puVar30;
                    puVar30 = (undefined4 *)((long)puVar30 + (long)local_118 * local_e8[0]);
                  }
                  puVar49 = (undefined4 *)((long)puVar49 + (long)iStack_fc * (long)local_118);
                  lVar18 = lVar18 + 0x10;
                }
                lVar34 = lVar34 + 4;
              }
            }
            iVar42 = (this->weight_winograd43_data).w;
            pvVar10 = (this->weight_winograd43_data).data;
            sVar11 = (this->weight_winograd43_data).elemsize;
            sVar12 = (this->weight_winograd43_data).cstep;
            uVar17 = uVar29 & 0xffffffff;
            while( true ) {
              uVar33 = (uint)uVar17;
              if (lVar26 <= (long)uVar29) break;
              pvVar37 = (void *)((ulong)((uVar33 & 3) + (int)(uVar17 >> 3) +
                                        (uint)((uVar33 >> 2 & 1) != 0)) * sVar11 * sVar12 +
                                (long)pvVar10);
              lVar34 = 0;
              for (lVar36 = 0; lVar36 != 0x24; lVar36 = lVar36 + 1) {
                puVar49 = (undefined4 *)
                          (local_e8[0] * uVar29 * (long)local_118 + lVar34 +
                          (long)pd._vptr_ParamDict);
                for (uVar17 = 0; uVar28 != uVar17; uVar17 = uVar17 + 1) {
                  *(undefined4 *)((long)pvVar37 + uVar17 * 4) = *puVar49;
                  puVar49 = (undefined4 *)((long)puVar49 + (long)iStack_fc * (long)local_118);
                }
                lVar34 = lVar34 + 4;
                pvVar37 = (void *)((long)pvVar37 + (long)iVar42 * sVar11);
              }
              uVar29 = uVar29 + 1;
              uVar17 = (ulong)(uVar33 + 1);
            }
            piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
            if (piVar8 == (int *)0x0) goto LAB_00225247;
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 != 0) goto LAB_00225247;
            if (local_108 != (Allocator *)0x0) {
              (*local_108->_vptr_Allocator[3])();
              goto LAB_00225247;
            }
          }
          else {
            if (bVar21 == false) goto LAB_00224f91;
LAB_00225872:
            local_e8[0] = 0;
            pd._vptr_ParamDict = (_func_int **)0x0;
            pd.d._0_4_ = 0;
            pd.d._4_4_ = 0;
            local_118 = SUB168(ZEXT816(0),4);
            local_110 = 0;
            local_108 = (Allocator *)0x0;
            iStack_100 = 0;
            local_f0[0] = 0;
            uVar29 = 0;
            iStack_fc = pd.d._4_4_;
            sStack_f8 = (size_t)local_118;
            Mat::create((Mat *)&pd,0x10,num_input,uVar33,4,(Allocator *)0x0);
            uVar28 = 0;
            if (0 < (int)num_input) {
              uVar28 = uVar17;
            }
            uVar17 = 0;
            if (0 < (int)uVar33) {
              uVar17 = (ulong)uVar33;
            }
            for (; uVar29 != uVar17; uVar29 = uVar29 + 1) {
              lVar34 = (long)(int)(num_input * 9 * (int)uVar29) * 4 +
                       *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
              lVar36 = (long)iStack_fc * (long)local_118;
              pp_Var39 = (_func_int **)
                         ((long)local_118 * local_e8[0] * uVar29 + (long)pd._vptr_ParamDict);
              for (uVar40 = 0; uVar40 != uVar28; uVar40 = uVar40 + 1) {
                lVar18 = uVar40 * 0x24;
                fVar2 = *(float *)(lVar34 + 0x18 + lVar18);
                fVar3 = *(float *)(lVar34 + 0x1c + lVar18);
                fVar4 = *(float *)(lVar34 + 0x20 + lVar18);
                auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar18)),
                                        ZEXT416(*(uint *)(lVar34 + 0x10 + lVar18)),0x10);
                auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 0xc + lVar18)),
                                        ZEXT416(*(uint *)(lVar34 + 4 + lVar18)),0x10);
                auVar62 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + 8 + lVar18)),
                                        ZEXT416(*(uint *)(lVar34 + 0x14 + lVar18)),0x10);
                for (lVar18 = 8; lVar18 != 0x38; lVar18 = lVar18 + 0xc) {
                  uVar45 = *(ulong *)(&UNK_004c87b8 + lVar18);
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ = uVar45;
                  fVar65 = (float)uVar45;
                  auVar83._0_4_ = fVar65 * auVar61._0_4_;
                  fVar76 = (float)(uVar45 >> 0x20);
                  auVar83._4_4_ = fVar76 * auVar61._4_4_;
                  auVar83._8_4_ = auVar61._8_4_ * 0.0;
                  auVar83._12_4_ = auVar61._12_4_ * 0.0;
                  auVar89 = vshufps_avx(auVar83,auVar83,0xe1);
                  fVar5 = *(float *)((long)&DAT_004c87c0 + lVar18);
                  auVar84._0_4_ = fVar65 * auVar14._0_4_ + fVar5 * auVar62._0_4_ + auVar89._0_4_;
                  auVar84._4_4_ = fVar76 * auVar14._4_4_ + fVar5 * auVar62._4_4_ + auVar89._4_4_;
                  auVar84._8_4_ = auVar14._8_4_ * 0.0 + fVar5 * auVar62._8_4_ + auVar89._8_4_;
                  auVar84._12_4_ = auVar14._12_4_ * 0.0 + fVar5 * auVar62._12_4_ + auVar89._12_4_;
                  uVar6 = vmovlps_avx(auVar84);
                  *(undefined8 *)((long)&local_180 + lVar18) = uVar6;
                  auVar89 = vmovshdup_avx(auVar69);
                  *(float *)((long)&pd_5._vptr_ParamDict + lVar18) =
                       auVar89._0_4_ * fVar3 + fVar5 * fVar4 + fVar65 * fVar2;
                }
                pp_Var41 = pp_Var39;
                for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                  fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc);
                  uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar18 * 0xc + 4);
                  puVar25 = (undefined8 *)((long)&DAT_004c87c0 + 4);
                  for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                    auVar58._0_4_ = (float)*puVar25 * (float)uVar6;
                    auVar58._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar6 >> 0x20)
                    ;
                    auVar58._8_8_ = 0;
                    auVar14 = vmovshdup_avx(auVar58);
                    *(float *)((long)pp_Var41 + lVar19 * 4) =
                         auVar58._0_4_ + fVar2 * *(float *)((long)puVar25 + -4) + auVar14._0_4_;
                    puVar25 = (undefined8 *)((long)puVar25 + 0xc);
                  }
                  pp_Var41 = pp_Var41 + 2;
                }
                pp_Var39 = (_func_int **)((long)pp_Var39 + lVar36);
              }
            }
            Mat::create(&this->weight_winograd23_data,num_input << 3,0x10,
                        (int)uVar33 / 8 + (int)uVar33 % 4 +
                        (int)(char)((char)((long)(int)uVar33 % 8) / '\x04'),4,(Allocator *)0x0);
            iVar42 = (this->weight_winograd23_data).w;
            pvVar10 = (this->weight_winograd23_data).data;
            sVar11 = (this->weight_winograd23_data).elemsize;
            sVar12 = (this->weight_winograd23_data).cstep;
            for (uVar29 = 0; (long)(uVar29 | 7) < lVar26; uVar29 = uVar29 + 8) {
              lVar34 = 0;
              for (lVar36 = 0; lVar36 != 0x10; lVar36 = lVar36 + 1) {
                lVar18 = (long)pvVar10 +
                         (long)iVar42 * sVar11 * lVar36 + (uVar29 >> 3) * sVar12 * sVar11;
                puVar49 = (undefined4 *)
                          ((long)local_118 * local_e8[0] * uVar29 + lVar34 +
                          (long)pd._vptr_ParamDict);
                for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
                  puVar30 = puVar49;
                  for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 4) {
                    *(undefined4 *)(lVar18 + lVar19) = *puVar30;
                    puVar30 = (undefined4 *)((long)puVar30 + (long)local_118 * local_e8[0]);
                  }
                  puVar49 = (undefined4 *)((long)puVar49 + (long)iStack_fc * (long)local_118);
                  lVar18 = lVar18 + 0x20;
                }
                lVar34 = lVar34 + 4;
              }
            }
            iVar42 = (this->weight_winograd23_data).w;
            pvVar10 = (this->weight_winograd23_data).data;
            sVar11 = (this->weight_winograd23_data).elemsize;
            sVar12 = (this->weight_winograd23_data).cstep;
            for (; (long)(uVar29 | 3) < lVar26; uVar29 = uVar29 + 4) {
              lVar34 = 0;
              for (lVar36 = 0; lVar36 != 0x10; lVar36 = lVar36 + 1) {
                lVar18 = (long)pvVar10 +
                         (long)iVar42 * sVar11 * lVar36 +
                         (ulong)(((uint)(uVar29 >> 3) & 0x1fffffff) +
                                (uint)(((uint)uVar29 >> 2 & 1) != 0)) * sVar12 * sVar11;
                puVar49 = (undefined4 *)
                          ((long)local_118 * local_e8[0] * uVar29 + lVar34 +
                          (long)pd._vptr_ParamDict);
                for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
                  puVar30 = puVar49;
                  for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 4) {
                    *(undefined4 *)(lVar18 + lVar19) = *puVar30;
                    puVar30 = (undefined4 *)((long)puVar30 + (long)local_118 * local_e8[0]);
                  }
                  puVar49 = (undefined4 *)((long)puVar49 + (long)iStack_fc * (long)local_118);
                  lVar18 = lVar18 + 0x10;
                }
                lVar34 = lVar34 + 4;
              }
            }
            iVar42 = (this->weight_winograd23_data).w;
            pvVar10 = (this->weight_winograd23_data).data;
            sVar11 = (this->weight_winograd23_data).elemsize;
            sVar12 = (this->weight_winograd23_data).cstep;
            uVar17 = uVar29 & 0xffffffff;
            while( true ) {
              uVar33 = (uint)uVar17;
              if (lVar26 <= (long)uVar29) break;
              pvVar37 = (void *)((ulong)((uVar33 & 3) + (int)(uVar17 >> 3) +
                                        (uint)((uVar33 >> 2 & 1) != 0)) * sVar11 * sVar12 +
                                (long)pvVar10);
              lVar34 = 0;
              for (lVar36 = 0; lVar36 != 0x10; lVar36 = lVar36 + 1) {
                puVar49 = (undefined4 *)
                          (local_e8[0] * uVar29 * (long)local_118 + lVar34 +
                          (long)pd._vptr_ParamDict);
                for (uVar17 = 0; uVar28 != uVar17; uVar17 = uVar17 + 1) {
                  *(undefined4 *)((long)pvVar37 + uVar17 * 4) = *puVar49;
                  puVar49 = (undefined4 *)((long)puVar49 + (long)iStack_fc * (long)local_118);
                }
                lVar34 = lVar34 + 4;
                pvVar37 = (void *)((long)pvVar37 + (long)iVar42 * sVar11);
              }
              uVar29 = uVar29 + 1;
              uVar17 = (ulong)(uVar33 + 1);
            }
            piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
            if (piVar8 == (int *)0x0) goto LAB_00225247;
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 != 0) goto LAB_00225247;
            if (local_108 != (Allocator *)0x0) {
              (*local_108->_vptr_Allocator[3])();
              goto LAB_00225247;
            }
          }
          free(pd._vptr_ParamDict);
          goto LAB_00225247;
        }
      }
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var46 != (_func_int *)0xfffffffffffffeb0) {
        piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (this->weight_data_tm).refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar9 = (this->weight_data_tm).allocator;
            if (pAVar9 == (Allocator *)0x0) {
              free((this->weight_data_tm).data);
            }
            else {
              (*pAVar9->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).c = 0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        p_Var1 = (_func_int *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        piVar8 = *(int **)(p_Var1 + 8);
        (this->weight_data_tm).data = *(void **)p_Var1;
        (this->weight_data_tm).refcount = piVar8;
        (this->weight_data_tm).elemsize =
             *(size_t *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var46);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var46);
        (this->weight_data_tm).allocator =
             *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var46);
        p_Var1 = (_func_int *)((long)&(this->scale_in_data).refcount + (long)p_Var46);
        uVar6 = *(undefined8 *)p_Var1;
        uVar15 = *(undefined8 *)(p_Var1 + 8);
        (this->weight_data_tm).dims = (int)uVar6;
        (this->weight_data_tm).w = (int)((ulong)uVar6 >> 0x20);
        (this->weight_data_tm).h = (int)uVar15;
        (this->weight_data_tm).d = (int)((ulong)uVar15 >> 0x20);
        (this->weight_data_tm).c = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var46);
        (this->weight_data_tm).cstep =
             *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var46);
      }
      goto LAB_00225247;
    }
    iVar22 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
    iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
  }
  convolution_im2col_sgemm_transform_kernel_sse
            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
             &this->weight_sgemm_data,num_input,iVar22,iVar42,iVar38);
LAB_00225247:
  if (opt->lightmode == true) {
    p_Var46 = this->_vptr_Convolution_x86_avx[-3];
    piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        plVar13 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var46);
        if (plVar13 == (long *)0x0) {
          free(*(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var46));
        }
        else {
          (**(code **)(*plVar13 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var46) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var46 + 4)) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var46) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var46) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}